

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse41_128_32.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_table_diag_sse41_128_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int *piVar1;
  bool bVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  uint uVar7;
  parasail_result_t *ppVar8;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  int32_t *ptr_02;
  long lVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  int iVar27;
  int iVar28;
  int iVar29;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar30;
  int iVar34;
  int iVar35;
  int iVar36;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar37 [16];
  uint uVar40;
  uint uVar41;
  uint uVar42;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 in_XMM4 [16];
  int iVar43;
  int iVar46;
  int iVar47;
  int iVar48;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  int iVar56;
  undefined1 auVar55 [16];
  int local_1a8;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  undefined1 local_198 [16];
  long local_178;
  long local_170;
  long local_168;
  long local_160;
  int local_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  uint local_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  undefined1 local_128 [16];
  long local_118;
  int *local_110;
  ulong local_108;
  ulong local_100;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_table_diag_sse41_128_32_cold_7();
    return (parasail_result_t *)0x0;
  }
  uVar21 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    parasail_sg_flags_table_diag_sse41_128_32_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_sg_flags_table_diag_sse41_128_32_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_sg_flags_table_diag_sse41_128_32_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sg_flags_table_diag_sse41_128_32_cold_3();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    if (_s1 == (char *)0x0) {
      parasail_sg_flags_table_diag_sse41_128_32_cold_2();
      return (parasail_result_t *)0x0;
    }
    if (_s1Len < 1) {
      parasail_sg_flags_table_diag_sse41_128_32_cold_1();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    _s1Len = matrix->length;
  }
  iVar6 = _s1Len + 3;
  uVar7 = s2Len + 3;
  iVar17 = -open;
  iVar16 = matrix->min;
  uVar14 = 0x80000000 - iVar16;
  if (iVar16 != iVar17 && SBORROW4(iVar16,iVar17) == iVar16 + open < 0) {
    uVar14 = open | 0x80000000;
  }
  iVar16 = uVar14 + 1;
  uVar14 = 0x7ffffffe - matrix->max;
  local_158 = 0;
  iStack_154 = 0;
  iStack_150 = 0;
  iStack_14c = 0;
  if (s1_beg == 0) {
    local_f8 = gap << 2;
    iStack_f4 = gap << 2;
    iStack_f0 = gap << 2;
    iStack_ec = gap << 2;
  }
  else {
    local_f8 = 0;
    iStack_f4 = 0;
    iStack_f0 = 0;
    iStack_ec = 0;
  }
  local_b8._0_8_ = CONCAT44(iVar16,iVar16);
  local_b8._8_8_ = CONCAT44(iVar16,iVar16);
  local_c8._8_8_ = local_b8._8_8_;
  local_c8._0_8_ = local_b8._0_8_;
  local_d8._8_8_ = local_b8._8_8_;
  local_d8._0_8_ = local_b8._0_8_;
  local_128._8_8_ = local_b8._8_8_;
  local_128._0_8_ = local_b8._0_8_;
  local_e8._8_8_ = local_b8._8_8_;
  local_e8._0_8_ = local_b8._0_8_;
  if (s1_beg == 0) {
    iStack_150 = iVar17 - gap;
    iStack_154 = iVar17 + gap * -2;
    local_158 = -(gap * 3 + open);
    iStack_14c = iVar17;
  }
  local_48 = gap;
  iStack_44 = gap;
  iStack_40 = gap;
  iStack_3c = gap;
  ppVar8 = parasail_result_new_table1(_s1Len,s2Len);
  if (ppVar8 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar8->flag = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar8->flag | 0x4421002;
  uVar12 = (ulong)(s2Len + 6);
  ptr = parasail_memalign_int32_t(0x10,uVar12);
  ptr_00 = parasail_memalign_int32_t(0x10,uVar12);
  ptr_01 = parasail_memalign_int32_t(0x10,uVar12);
  if (ptr_01 == (int32_t *)0x0 || (ptr_00 == (int32_t *)0x0 || ptr == (int32_t *)0x0)) {
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    ptr_02 = parasail_memalign_int32_t(0x10,(long)iVar6);
    if (ptr_02 == (int32_t *)0x0) {
      return (parasail_result_t *)0x0;
    }
    if (0 < _s1Len) {
      piVar1 = matrix->mapper;
      uVar12 = 0;
      do {
        ptr_02[uVar12] = piVar1[(byte)_s1[uVar12]];
        uVar12 = uVar12 + 1;
      } while ((uint)_s1Len != uVar12);
    }
    iVar23 = _s1Len + 1U;
    if ((int)(_s1Len + 1U) < iVar6) {
      iVar23 = iVar6;
    }
    memset(ptr_02 + _s1Len,0,(ulong)(uint)(~_s1Len + iVar23) * 4 + 4);
  }
  else {
    ptr_02 = (int32_t *)0x0;
  }
  local_98 = _s1Len - 1;
  iStack_94 = _s1Len - 1;
  iStack_90 = _s1Len - 1;
  iStack_8c = _s1Len - 1;
  local_68 = s2Len + -1;
  iStack_64 = s2Len + -1;
  iStack_60 = s2Len + -1;
  iStack_5c = s2Len + -1;
  piVar1 = matrix->mapper;
  uVar12 = 0;
  do {
    ptr[uVar12 + 3] = piVar1[(byte)_s2[uVar12]];
    uVar12 = uVar12 + 1;
  } while (uVar21 != uVar12);
  ptr[2] = 0;
  ptr[0] = 0;
  ptr[1] = 0;
  uVar10 = s2Len + 1U;
  if ((int)(s2Len + 1U) < (int)uVar7) {
    uVar10 = uVar7;
  }
  local_88 = open;
  iStack_84 = open;
  iStack_80 = open;
  iStack_7c = open;
  local_78 = s2Len;
  iStack_74 = s2Len;
  iStack_70 = s2Len;
  iStack_6c = s2Len;
  local_58 = _s1Len;
  uStack_54 = _s1Len;
  uStack_50 = _s1Len;
  uStack_4c = _s1Len;
  memset(ptr + uVar21 + 3,0,(ulong)(~s2Len + uVar10) * 4 + 4);
  uVar12 = 0;
  iVar6 = iVar17;
  if (s2_beg == 0) {
    do {
      ptr_00[uVar12 + 3] = iVar6;
      ptr_01[uVar12 + 3] = iVar16;
      uVar12 = uVar12 + 1;
      iVar6 = iVar6 - gap;
    } while (uVar21 != uVar12);
  }
  else {
    do {
      ptr_00[uVar12 + 3] = 0;
      ptr_01[uVar12 + 3] = iVar16;
      uVar12 = uVar12 + 1;
    } while (uVar21 != uVar12);
  }
  lVar9 = 0;
  do {
    ptr_00[lVar9] = iVar16;
    ptr_01[lVar9] = iVar16;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  lVar9 = uVar21 + 3;
  uVar12 = uVar21;
  do {
    ptr_00[lVar9] = iVar16;
    ptr_01[lVar9] = iVar16;
    lVar9 = lVar9 + 1;
    uVar10 = (int)uVar12 + 1;
    uVar12 = (ulong)uVar10;
  } while ((int)uVar10 < (int)uVar7);
  ptr_00[2] = 0;
  local_138 = uVar14;
  uStack_134 = uVar14;
  uStack_130 = uVar14;
  uStack_12c = uVar14;
  if (_s1Len < 1) {
    local_198._4_4_ = iVar16;
    local_198._0_4_ = iVar16;
    local_198._8_4_ = iVar16;
    local_198._12_4_ = iVar16;
    local_e8 = local_198;
    local_128 = local_198;
    local_d8 = local_198;
  }
  else {
    local_110 = matrix->matrix;
    uVar10 = _s1Len - 1;
    auVar3._4_4_ = iVar16;
    auVar3._0_4_ = iVar16;
    auVar3._8_4_ = iVar16;
    local_e8._12_4_ = iVar16;
    local_e8._0_12_ = auVar3;
    local_a8 = local_e8 >> 0x20;
    auVar26 = local_a8;
    local_100 = 1;
    if (1 < (int)uVar7) {
      local_100 = (ulong)uVar7;
    }
    uVar15 = (ulong)(uint)_s1Len;
    local_160 = uVar21 * 0xc + -0xc;
    local_118 = uVar21 * 0x10;
    local_168 = uVar21 * 4 + -4;
    local_178 = uVar21 * 8 + -8;
    local_1a8 = 3;
    iStack_1a4 = 2;
    iStack_1a0 = 1;
    iStack_19c = 0;
    local_170 = 0;
    uVar12 = 0;
    local_128 = local_e8;
    local_d8 = local_e8;
    local_c8 = local_e8;
    local_b8 = local_e8;
    local_198 = local_e8;
    do {
      uVar13 = uVar12 | 3;
      uVar7 = (uint)uVar12;
      if (matrix->type == 0) {
        uVar11 = ptr_02[uVar12 + 1];
        uVar18 = ptr_02[uVar12 + 2];
        uVar20 = ptr_02[uVar12];
        uVar22 = ptr_02[uVar13];
      }
      else {
        uVar11 = uVar7 | 1;
        if (uVar15 <= (uVar12 | 1)) {
          uVar11 = uVar10;
        }
        uVar18 = uVar7 | 2;
        if (uVar15 <= (uVar12 | 2)) {
          uVar18 = uVar10;
        }
        uVar20 = uVar7;
        uVar22 = uVar7 | 3;
        if (uVar15 <= uVar13) {
          uVar22 = uVar10;
        }
      }
      iVar6 = matrix->size;
      local_108 = uVar12 + 4;
      local_a8._0_8_ = auVar3._4_8_;
      auVar49._12_4_ = ptr_00[2];
      auVar49._8_4_ = iVar16;
      auVar49._0_8_ = local_a8._0_8_;
      ptr_00[2] = iVar17 - (int)local_108 * gap;
      iVar23 = iVar17 - uVar7 * gap;
      if (s1_beg != 0) {
        iVar23 = 0;
      }
      auVar55._12_4_ = iVar23;
      auVar55._8_4_ = iVar16;
      auVar55._0_8_ = local_a8._0_8_;
      auVar52._0_4_ = -(uint)(local_98 == local_1a8);
      auVar52._4_4_ = -(uint)(iStack_94 == iStack_1a4);
      auVar52._8_4_ = -(uint)(iStack_90 == iStack_1a0);
      auVar52._12_4_ = -(uint)(iStack_8c == iStack_19c);
      uVar19 = 0;
      in_XMM4 = pmovsxbd(in_XMM4,0xfffefd);
      auVar45._4_4_ = iVar16;
      auVar45._0_4_ = iVar16;
      auVar45._8_4_ = iVar16;
      auVar45._12_4_ = iVar16;
      auVar54 = auVar45;
      do {
        iVar56 = auVar55._12_4_;
        auVar51._0_8_ = auVar55._4_8_;
        auVar50._0_12_ = auVar55._4_12_;
        auVar50._12_4_ = iVar56;
        auVar51._8_8_ = auVar50._8_8_ & 0xffffffff | (ulong)(uint)ptr_00[uVar19 + 3] << 0x20;
        iVar30 = local_110[(long)(int)(uVar22 * iVar6) + (long)ptr[uVar19]] + auVar49._0_4_;
        iVar34 = local_110[(long)(int)(uVar18 * iVar6) + (long)ptr[uVar19 + 1]] + auVar49._4_4_;
        iVar35 = local_110[(long)(int)(uVar11 * iVar6) + (long)ptr[uVar19 + 2]] + auVar49._8_4_;
        iVar36 = local_110[(long)(int)(uVar20 * iVar6) + (long)ptr[uVar19 + 3]] + auVar49._12_4_;
        iVar23 = auVar55._4_4_ - local_88;
        iVar27 = auVar55._8_4_ - iStack_84;
        iVar28 = iVar56 - iStack_80;
        iVar29 = ptr_00[uVar19 + 3] - iStack_7c;
        iVar43 = auVar45._4_4_ - local_48;
        iVar46 = auVar45._8_4_ - iStack_44;
        iVar47 = auVar45._12_4_ - iStack_40;
        iVar48 = ptr_01[uVar19 + 3] - iStack_3c;
        auVar44._0_4_ = (uint)(iVar43 < iVar23) * iVar23 | (uint)(iVar43 >= iVar23) * iVar43;
        auVar44._4_4_ = (uint)(iVar46 < iVar27) * iVar27 | (uint)(iVar46 >= iVar27) * iVar46;
        auVar44._8_4_ = (uint)(iVar47 < iVar28) * iVar28 | (uint)(iVar47 >= iVar28) * iVar47;
        auVar44._12_4_ = (uint)(iVar48 < iVar29) * iVar29 | (uint)(iVar48 >= iVar29) * iVar48;
        iVar43 = auVar55._0_4_ - local_88;
        iVar46 = auVar55._4_4_ - iStack_84;
        iVar47 = auVar55._8_4_ - iStack_80;
        iVar56 = iVar56 - iStack_7c;
        iVar23 = auVar54._0_4_ - local_48;
        iVar27 = auVar54._4_4_ - iStack_44;
        iVar28 = auVar54._8_4_ - iStack_40;
        iVar29 = auVar54._12_4_ - iStack_3c;
        auVar53._0_4_ = (uint)(iVar23 < iVar43) * iVar43 | (uint)(iVar23 >= iVar43) * iVar23;
        auVar53._4_4_ = (uint)(iVar27 < iVar46) * iVar46 | (uint)(iVar27 >= iVar46) * iVar27;
        auVar53._8_4_ = (uint)(iVar28 < iVar47) * iVar47 | (uint)(iVar28 >= iVar47) * iVar28;
        auVar53._12_4_ = (uint)(iVar29 < iVar56) * iVar56 | (uint)(iVar29 >= iVar56) * iVar29;
        uVar7 = ((int)auVar53._0_4_ < (int)auVar44._0_4_) * auVar44._0_4_ |
                ((int)auVar53._0_4_ >= (int)auVar44._0_4_) * auVar53._0_4_;
        uVar40 = ((int)auVar53._4_4_ < (int)auVar44._4_4_) * auVar44._4_4_ |
                 ((int)auVar53._4_4_ >= (int)auVar44._4_4_) * auVar53._4_4_;
        uVar41 = ((int)auVar53._8_4_ < (int)auVar44._8_4_) * auVar44._8_4_ |
                 ((int)auVar53._8_4_ >= (int)auVar44._8_4_) * auVar53._8_4_;
        uVar42 = ((int)auVar53._12_4_ < (int)auVar44._12_4_) * auVar44._12_4_ |
                 ((int)auVar53._12_4_ >= (int)auVar44._12_4_) * auVar53._12_4_;
        auVar38._0_4_ = (uint)((int)uVar7 < iVar30) * iVar30 | ((int)uVar7 >= iVar30) * uVar7;
        auVar38._4_4_ = (uint)((int)uVar40 < iVar34) * iVar34 | ((int)uVar40 >= iVar34) * uVar40;
        auVar38._8_4_ = (uint)((int)uVar41 < iVar35) * iVar35 | ((int)uVar41 >= iVar35) * uVar41;
        auVar38._12_4_ = (uint)((int)uVar42 < iVar36) * iVar36 | ((int)uVar42 >= iVar36) * uVar42;
        iVar30 = in_XMM4._0_4_;
        auVar24._0_4_ = -(uint)(iVar30 == -1);
        iVar34 = in_XMM4._4_4_;
        auVar24._4_4_ = -(uint)(iVar34 == -1);
        iVar35 = in_XMM4._8_4_;
        iVar36 = in_XMM4._12_4_;
        auVar24._8_4_ = -(uint)(iVar35 == -1);
        auVar24._12_4_ = -(uint)(iVar36 == -1);
        auVar5._4_4_ = iStack_154;
        auVar5._0_4_ = local_158;
        auVar5._8_4_ = iStack_150;
        auVar5._12_4_ = iStack_14c;
        auVar55 = blendvps(auVar38,auVar5,auVar24);
        auVar54._4_4_ = iVar16;
        auVar54._0_4_ = iVar16;
        auVar54._8_4_ = iVar16;
        auVar54._12_4_ = iVar16;
        auVar45 = blendvps(auVar44,auVar54,auVar24);
        auVar54 = blendvps(auVar53,auVar54,auVar24);
        iVar29 = auVar55._0_4_;
        iVar23 = auVar55._4_4_;
        iVar28 = auVar55._12_4_;
        iVar27 = auVar55._8_4_;
        if (3 < uVar19) {
          local_138 = (uint)(iVar29 < (int)local_138) * iVar29 |
                      (iVar29 >= (int)local_138) * local_138;
          uStack_134 = (uint)(iVar23 < (int)uStack_134) * iVar23 |
                       (iVar23 >= (int)uStack_134) * uStack_134;
          uStack_130 = (uint)(iVar27 < (int)uStack_130) * iVar27 |
                       (iVar27 >= (int)uStack_130) * uStack_130;
          uStack_12c = (uint)(iVar28 < (int)uStack_12c) * iVar28 |
                       (iVar28 >= (int)uStack_12c) * uStack_12c;
          local_198._4_4_ =
               (uint)((int)local_198._4_4_ < iVar23) * iVar23 |
               (uint)((int)local_198._4_4_ >= iVar23) * local_198._4_4_;
          local_198._0_4_ =
               (uint)((int)local_198._0_4_ < iVar29) * iVar29 |
               (uint)((int)local_198._0_4_ >= iVar29) * local_198._0_4_;
          local_198._8_4_ =
               (uint)((int)local_198._8_4_ < iVar27) * iVar27 |
               (uint)((int)local_198._8_4_ >= iVar27) * local_198._8_4_;
          local_198._12_4_ =
               (uint)((int)local_198._12_4_ < iVar28) * iVar28 |
               (uint)((int)local_198._12_4_ >= iVar28) * local_198._12_4_;
        }
        piVar1 = ((ppVar8->field_4).rowcols)->score_row;
        if (uVar19 < uVar21) {
          *(int *)((long)piVar1 + uVar19 * 4 + local_170) = iVar28;
        }
        if (uVar19 - 1 < uVar21 && (uVar12 | 1) < uVar15) {
          *(int *)((long)piVar1 + uVar19 * 4 + local_168) = iVar27;
        }
        if (((uVar12 | 2) < uVar15) && ((long)(uVar19 - 2) < (long)uVar21 && 1 < uVar19)) {
          *(int *)((long)piVar1 + uVar19 * 4 + local_178) = iVar23;
        }
        if (2 < uVar19 && uVar13 < uVar15) {
          *(int *)((long)piVar1 + uVar19 * 4 + local_160) = iVar29;
        }
        auVar4._4_4_ = iStack_1a4;
        auVar4._0_4_ = local_1a8;
        auVar4._8_4_ = iStack_1a0;
        auVar4._12_4_ = iStack_19c;
        auVar31._0_4_ = -(uint)(local_1a8 < (int)local_58);
        auVar31._4_4_ = -(uint)(iStack_1a4 < (int)uStack_54);
        auVar31._8_4_ = -(uint)(iStack_1a0 < (int)uStack_50);
        auVar31._12_4_ = -(uint)(iStack_19c < (int)uStack_4c);
        auVar25._0_4_ = -(uint)(iVar30 < local_78);
        auVar25._4_4_ = -(uint)(iVar34 < iStack_74);
        auVar25._8_4_ = -(uint)(iVar35 < iStack_70);
        auVar25._12_4_ = -(uint)(iVar36 < iStack_6c);
        auVar37._0_4_ = -(uint)(local_b8._0_4_ < iVar29);
        auVar37._4_4_ = -(uint)(local_b8._4_4_ < iVar23);
        auVar37._8_4_ = -(uint)(local_b8._8_4_ < iVar27);
        auVar37._12_4_ = -(uint)(local_b8._12_4_ < iVar28);
        auVar37 = ~in_XMM4 & auVar25 & auVar52 & auVar37;
        local_b8 = blendvps(local_b8,auVar38,auVar37);
        auVar39._0_4_ = -(uint)(local_68 == iVar30);
        auVar39._4_4_ = -(uint)(iStack_64 == iVar34);
        auVar39._8_4_ = -(uint)(iStack_60 == iVar35);
        auVar39._12_4_ = -(uint)(iStack_5c == iVar36);
        auVar32._0_4_ = -(uint)(local_c8._0_4_ < iVar29);
        auVar32._4_4_ = -(uint)(local_c8._4_4_ < iVar23);
        auVar32._8_4_ = -(uint)(local_c8._8_4_ < iVar27);
        auVar32._12_4_ = -(uint)(local_c8._12_4_ < iVar28);
        auVar32 = auVar31 & auVar39 & auVar32;
        local_c8 = blendvps(local_c8,auVar55,auVar32);
        local_d8 = blendvps(local_d8,auVar55,auVar39 & auVar52);
        local_128 = blendvps(local_128,auVar4,auVar32);
        local_e8 = blendvps(local_e8,in_XMM4,auVar37);
        ptr_00[uVar19] = iVar29;
        ptr_01[uVar19] = auVar45._0_4_;
        in_XMM4._0_4_ = iVar30 + 1;
        in_XMM4._4_4_ = iVar34 + 1;
        in_XMM4._8_4_ = iVar35 + 1;
        in_XMM4._12_4_ = iVar36 + 1;
        uVar19 = uVar19 + 1;
        auVar49 = auVar51;
      } while (local_100 != uVar19);
      local_1a8 = local_1a8 + 4;
      iStack_1a4 = iStack_1a4 + 4;
      iStack_1a0 = iStack_1a0 + 4;
      iStack_19c = iStack_19c + 4;
      local_158 = local_158 - local_f8;
      iStack_154 = iStack_154 - iStack_f4;
      iStack_150 = iStack_150 - iStack_f0;
      iStack_14c = iStack_14c - iStack_ec;
      local_160 = local_160 + local_118;
      local_170 = local_170 + local_118;
      local_168 = local_168 + local_118;
      local_178 = local_178 + local_118;
      uVar12 = local_108;
    } while (local_108 < uVar15);
    local_a8 = auVar26;
  }
  lVar9 = 0;
  iVar27 = 0;
  iVar23 = 0;
  iVar6 = 0;
  iVar17 = iVar16;
  iVar28 = iVar16;
  iVar29 = iVar16;
  do {
    iVar30 = *(int *)(local_c8 + lVar9 * 4);
    if (iVar28 < iVar30) {
      iVar23 = *(int *)(local_128 + lVar9 * 4);
      iVar27 = *(int *)(local_128 + lVar9 * 4);
      iVar28 = iVar30;
    }
    else if ((iVar30 == iVar28) &&
            (iVar34 = *(int *)(local_128 + lVar9 * 4), bVar2 = iVar34 < iVar23, iVar23 = iVar27,
            bVar2)) {
      iVar23 = iVar34;
      iVar27 = iVar34;
      iVar28 = iVar30;
    }
    if (iVar29 < *(int *)(local_b8 + lVar9 * 4)) {
      iVar6 = *(int *)(local_e8 + lVar9 * 4);
      iVar29 = *(int *)(local_b8 + lVar9 * 4);
    }
    if (iVar17 < *(int *)(local_d8 + lVar9 * 4)) {
      iVar17 = *(int *)(local_d8 + lVar9 * 4);
    }
    lVar9 = lVar9 + 1;
  } while ((int)lVar9 != 4);
  iVar27 = iVar6;
  if (s1_end == 0 || s2_end == 0) {
    if (s1_end != 0) goto LAB_006bc94f;
    iVar27 = s2Len + -1;
    if (s2_end != 0) {
      iVar17 = iVar29;
      iVar27 = iVar6;
    }
  }
  else {
    if (iVar29 < iVar28) {
LAB_006bc94f:
      iVar6 = s2Len + -1;
      iVar29 = iVar6;
      goto LAB_006bc9ae;
    }
    iVar17 = iVar29;
    if ((iVar28 == iVar29) && (iVar29 = s2Len + -1, iVar6 == s2Len + -1)) goto LAB_006bc9ae;
  }
  iVar28 = iVar17;
  iVar23 = _s1Len - 1;
  iVar29 = iVar27;
LAB_006bc9ae:
  auVar26._0_4_ = -(uint)((int)local_138 < iVar16);
  auVar26._4_4_ = -(uint)((int)uStack_134 < iVar16);
  auVar26._8_4_ = -(uint)((int)uStack_130 < iVar16);
  auVar26._12_4_ = -(uint)((int)uStack_12c < iVar16);
  auVar33._0_4_ = -(uint)((int)uVar14 < local_198._0_4_);
  auVar33._4_4_ = -(uint)((int)uVar14 < local_198._4_4_);
  auVar33._8_4_ = -(uint)((int)uVar14 < local_198._8_4_);
  auVar33._12_4_ = -(uint)((int)uVar14 < local_198._12_4_);
  iVar16 = movmskps(iVar6,auVar33 | auVar26);
  if (iVar16 != 0) {
    *(byte *)&ppVar8->flag = (byte)ppVar8->flag | 0x40;
    iVar28 = 0;
    iVar29 = 0;
    iVar23 = 0;
  }
  ppVar8->score = iVar28;
  ppVar8->end_query = iVar23;
  ppVar8->end_ref = iVar29;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  if (matrix->type == 0) {
    parasail_free(ptr_02);
    return ppVar8;
  }
  return ppVar8;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi32(NEG_LIMIT);
    vOpen = _mm_set1_epi32(open);
    vGap  = _mm_set1_epi32(gap);
    vOne = _mm_set1_epi32(1);
    vN = _mm_set1_epi32(N);
    vGapN = s1_beg ? _mm_set1_epi32(0) : _mm_set1_epi32(gap*N);
    vNegOne = _mm_set1_epi32(-1);
    vI = _mm_set_epi32(0,1,2,3);
    vJreset = _mm_set_epi32(0,-1,-2,-3);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi32(s1Len);
    vILimit1 = _mm_sub_epi32(vILimit, vOne);
    vJLimit = _mm_set1_epi32(s2Len);
    vJLimit1 = _mm_sub_epi32(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi32(0) : _mm_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        __m128i vIltLimit = _mm_cmplt_epi32(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi32(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 4);
        vNH = _mm_insert_epi32(vNH, H_pr[-1], 3);
        vWH = _mm_srli_si128(vWH, 4);
        vWH = _mm_insert_epi32(vWH, s1_beg ? 0 : (-open - i*gap), 3);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 4);
            vNH = _mm_insert_epi32(vNH, H_pr[j], 3);
            vF = _mm_srli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, F_pr[j], 3);
            vF = _mm_max_epi32(
                    _mm_sub_epi32(vNH, vOpen),
                    _mm_sub_epi32(vF, vGap));
            vE = _mm_max_epi32(
                    _mm_sub_epi32(vWH, vOpen),
                    _mm_sub_epi32(vE, vGap));
            vMat = _mm_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm_add_epi32(vNWH, vMat);
            vWH = _mm_max_epi32(vNWH, vE);
            vWH = _mm_max_epi32(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int32_t)_mm_extract_epi32(vWH,0);
            F_pr[j-3] = (int32_t)_mm_extract_epi32(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi32(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi32(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi32(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi32(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi32(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_add_epi32(vJ, vOne);
        }
        vI = _mm_add_epi32(vI, vN);
        vIBoundary = _mm_sub_epi32(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int32_t max_row = NEG_LIMIT;
        int32_t max_col = NEG_LIMIT;
        int32_t last_val = NEG_LIMIT;
        int32_t *s = (int32_t*)&vMaxHRow;
        int32_t *t = (int32_t*)&vMaxHCol;
        int32_t *u = (int32_t*)&vLastVal;
        int32_t *i = (int32_t*)&vEndI;
        int32_t *j = (int32_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}